

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getUntilRx(Nibbler *this,string *regex,string *result)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  vector<int,_std::allocator<int>_> start;
  string local_d8;
  vector<int,_std::allocator<int>_> end;
  RX r;
  
  uVar1 = this->_length;
  uVar2 = this->_cursor;
  if (uVar2 < uVar1) {
    RX::RX(&r,regex,true);
    start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    end.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    end.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    end.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)this);
    bVar3 = RX::match(&r,&start,&end,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (bVar3) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)this);
      std::__cxx11::string::operator=((string *)result,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      sVar4 = (long)*start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + this->_cursor;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)this);
      std::__cxx11::string::operator=((string *)result,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      sVar4 = this->_length;
    }
    this->_cursor = sVar4;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&end.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&start.super__Vector_base<int,_std::allocator<int>_>);
    RX::~RX(&r);
  }
  return uVar2 < uVar1;
}

Assistant:

bool Nibbler::getUntilRx (const std::string& regex, std::string& result)
{
  if (_cursor < _length)
  {
    RX r (regex, true);
    std::vector <int> start;
    std::vector <int> end;
    if (r.match (start, end, _input.substr (_cursor)))
    {
      result = _input.substr (_cursor, start[0]);
      _cursor += start[0];
    }
    else
    {
      result = _input.substr (_cursor);
      _cursor = _length;
    }

    return true;
  }

  return false;
}